

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

IOTHUB_MESSAGE_RESULT
IoTHubMessage_SetMessageCreationTimeUtcSystemProperty
          (IOTHUB_MESSAGE_HANDLE iotHubMessageHandle,char *creationTimeUtc)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_MESSAGE_RESULT result;
  char *creationTimeUtc_local;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle_local;
  
  if ((iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) || (creationTimeUtc == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_SetMessageCreationTimeUtcSystemProperty",0x310,1,
                "Invalid argument (iotHubMessageHandle=%p, creationTimeUtc=%p)",iotHubMessageHandle,
                creationTimeUtc);
    }
    l._4_4_ = IOTHUB_MESSAGE_INVALID_ARG;
  }
  else {
    iVar1 = set_message_creation_time(iotHubMessageHandle,creationTimeUtc);
    if (iVar1 == 0) {
      l._4_4_ = IOTHUB_MESSAGE_OK;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                  ,"IoTHubMessage_SetMessageCreationTimeUtcSystemProperty",0x317,1,
                  "Failed saving a copy of creationTimeUtc");
      }
      l._4_4_ = IOTHUB_MESSAGE_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetMessageCreationTimeUtcSystemProperty(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle, const char* creationTimeUtc)
{
    IOTHUB_MESSAGE_RESULT result;

    if (iotHubMessageHandle == NULL || creationTimeUtc == NULL)
    {
        LogError("Invalid argument (iotHubMessageHandle=%p, creationTimeUtc=%p)", iotHubMessageHandle, creationTimeUtc);
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        if (set_message_creation_time(iotHubMessageHandle, creationTimeUtc) != 0)
        {
            LogError("Failed saving a copy of creationTimeUtc");
            result = IOTHUB_MESSAGE_ERROR;
        }
        else
        {
            result = IOTHUB_MESSAGE_OK;
        }
    }
    return result;
}